

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall GslSpan_AsBytes_Test::~GslSpan_AsBytes_Test(GslSpan_AsBytes_Test *this)

{
  GslSpan_AsBytes_Test *this_local;
  
  ~GslSpan_AsBytes_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, AsBytes) {
    int a[] = {1, 2, 3, 4};

    {
        span<int> s;
        auto bs = as_bytes (s);
        EXPECT_EQ (bs.length (), s.length ());
        EXPECT_EQ (bs.length (), 0);
        EXPECT_EQ (bs.size_bytes (), 0);
        EXPECT_EQ (static_cast<const void *> (bs.data ()), static_cast<const void *> (s.data ()));
        EXPECT_EQ (bs.data (), nullptr);
    }

    {
        span<int> s = make_span (a);
        auto bs = as_bytes (s);
        EXPECT_EQ (static_cast<const void *> (bs.data ()), static_cast<const void *> (s.data ()));
        EXPECT_EQ (bs.length (), s.length_bytes ());
    }
}